

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printStatementDescription(PrinterStream *this,Object *s)

{
  AssignFromValue *a;
  FunctionCall *f;
  ReadStream *r;
  WriteStream *w;
  AdvanceClock *pAVar1;
  Branch *b;
  BranchIf *b_00;
  ReturnVoid *pRVar2;
  ReturnValue *r_00;
  pool_ptr<const_soul::heart::AssignFromValue> t;
  pool_ptr<const_soul::heart::BranchIf> local_20;
  
  cast<soul::heart::AssignFromValue_const,soul::heart::Object_const>((soul *)&local_20,s);
  if (local_20.object == (BranchIf *)0x0) {
    cast<soul::heart::FunctionCall_const,soul::heart::Object_const>((soul *)&local_20,s);
    if (local_20.object == (BranchIf *)0x0) {
      cast<soul::heart::ReadStream_const,soul::heart::Object_const>((soul *)&local_20,s);
      if (local_20.object == (BranchIf *)0x0) {
        cast<soul::heart::WriteStream_const,soul::heart::Object_const>((soul *)&local_20,s);
        if (local_20.object == (BranchIf *)0x0) {
          cast<soul::heart::AdvanceClock_const,soul::heart::Object_const>((soul *)&local_20,s);
          if (local_20.object == (BranchIf *)0x0) {
            cast<soul::heart::Branch_const,soul::heart::Object_const>((soul *)&local_20,s);
            if (local_20.object == (BranchIf *)0x0) {
              cast<soul::heart::BranchIf_const,soul::heart::Object_const>((soul *)&local_20,s);
              if (local_20.object == (BranchIf *)0x0) {
                cast<soul::heart::ReturnVoid_const,soul::heart::Object_const>((soul *)&local_20,s);
                if (local_20.object == (BranchIf *)0x0) {
                  cast<soul::heart::ReturnValue_const,soul::heart::Object_const>
                            ((soul *)&local_20,s);
                  if (local_20.object == (BranchIf *)0x0) {
                    throwInternalCompilerError("printStatementDescription",0x238);
                  }
                  r_00 = pool_ptr<const_soul::heart::ReturnValue>::operator*
                                   ((pool_ptr<const_soul::heart::ReturnValue> *)&local_20);
                  printDescription(this,r_00);
                }
                else {
                  pRVar2 = pool_ptr<const_soul::heart::ReturnVoid>::operator*
                                     ((pool_ptr<const_soul::heart::ReturnVoid> *)&local_20);
                  printDescription(this,pRVar2);
                }
              }
              else {
                b_00 = pool_ptr<const_soul::heart::BranchIf>::operator*(&local_20);
                printDescription(this,b_00);
              }
            }
            else {
              b = pool_ptr<const_soul::heart::Branch>::operator*
                            ((pool_ptr<const_soul::heart::Branch> *)&local_20);
              printDescription(this,b);
            }
          }
          else {
            pAVar1 = pool_ptr<const_soul::heart::AdvanceClock>::operator*
                               ((pool_ptr<const_soul::heart::AdvanceClock> *)&local_20);
            printDescription(this,pAVar1);
          }
        }
        else {
          w = pool_ptr<const_soul::heart::WriteStream>::operator*
                        ((pool_ptr<const_soul::heart::WriteStream> *)&local_20);
          printDescription(this,w);
        }
      }
      else {
        r = pool_ptr<const_soul::heart::ReadStream>::operator*
                      ((pool_ptr<const_soul::heart::ReadStream> *)&local_20);
        printDescription(this,r);
      }
    }
    else {
      f = pool_ptr<const_soul::heart::FunctionCall>::operator*
                    ((pool_ptr<const_soul::heart::FunctionCall> *)&local_20);
      printDescription(this,f);
    }
  }
  else {
    a = pool_ptr<const_soul::heart::AssignFromValue>::operator*
                  ((pool_ptr<const_soul::heart::AssignFromValue> *)&local_20);
    printDescription(this,a);
  }
  return;
}

Assistant:

void printStatementDescription (const heart::Object& s)
        {
            #define SOUL_GET_STATEMENT_DESC(Type)     if (auto t = cast<const heart::Type> (s)) return printDescription (*t);
            SOUL_HEART_STATEMENTS (SOUL_GET_STATEMENT_DESC)
            SOUL_HEART_TERMINATORS (SOUL_GET_STATEMENT_DESC)

            SOUL_ASSERT_FALSE;
        }